

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

int Gia_MiniAigSuperMerge(Vec_Int_t *p,int nPis)

{
  int iVar1;
  undefined4 local_28;
  undefined4 local_24;
  int fChange;
  int Prev;
  int This;
  int k;
  int i;
  int nPis_local;
  Vec_Int_t *p_local;
  
  Prev = 0;
  local_24 = -1;
  local_28 = 0;
  for (This = 0; iVar1 = Vec_IntSize(p), This < iVar1; This = This + 1) {
    iVar1 = Vec_IntEntry(p,This);
    if (local_24 == iVar1) {
      Vec_IntWriteEntry(p,Prev,(iVar1 / nPis + 1) * nPis + iVar1 % nPis);
      local_24 = -1;
      local_28 = 1;
      iVar1 = local_24;
      Prev = Prev + 1;
    }
    else if (local_24 != -1) {
      Vec_IntWriteEntry(p,Prev,local_24);
      Prev = Prev + 1;
    }
    local_24 = iVar1;
  }
  if (local_24 != -1) {
    Vec_IntWriteEntry(p,Prev,local_24);
    Prev = Prev + 1;
  }
  Vec_IntShrink(p,Prev);
  return local_28;
}

Assistant:

int Gia_MiniAigSuperMerge( Vec_Int_t * p, int nPis )
{
    int i, k = 0, This, Prev = -1, fChange = 0;
    Vec_IntForEachEntry( p, This, i )
    {
        if ( Prev == This )
        {
            Vec_IntWriteEntry( p, k++, (This/nPis+1)*nPis + This%nPis );
            Prev = -1;
            fChange = 1;
        }
        else 
        {
            if ( Prev != -1 ) 
                Vec_IntWriteEntry( p, k++, Prev );
            Prev = This;
        }
    }
    if ( Prev != -1 )
        Vec_IntWriteEntry( p, k++, Prev );
    Vec_IntShrink( p, k );
    return fChange;
}